

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,const_iterator begin,const_iterator end,Style style)

{
  Twine local_b8;
  Twine local_a0;
  Twine local_88;
  Twine local_70;
  SmallVectorImpl<char> *local_58;
  char *local_50;
  StringRef *local_48;
  size_t local_40;
  Style local_34;
  
  local_40 = end.Position;
  local_50 = end.Path.Data;
  if ((begin.Path.Data != end.Path.Data) || (begin.Position != end.Position)) {
    local_48 = &begin.Component;
    local_58 = path;
    local_34 = style;
    do {
      do {
        Twine::Twine(&local_b8,local_48);
        Twine::Twine(&local_a0,"");
        Twine::Twine(&local_88,"");
        Twine::Twine(&local_70,"");
        append(local_58,local_34,&local_b8,&local_a0,&local_88,&local_70);
        const_iterator::operator++(&begin);
      } while (begin.Path.Data != local_50);
    } while (begin.Position != local_40);
  }
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, const_iterator begin,
            const_iterator end, Style style) {
  for (; begin != end; ++begin)
    path::append(path, style, *begin);
}